

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

char * cram_compress_by_method
                 (char *in,size_t in_size,size_t *out_size,cram_block_method method,int level,
                 int strat)

{
  int iVar1;
  char *pcVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  uint in_size_00;
  undefined1 auVar6 [16];
  uint out_size_i;
  uint local_98;
  undefined8 local_90;
  char *local_88;
  int local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined4 local_48;
  
  in_size_00 = (uint)in_size;
  if (method == RANS1) {
    iVar4 = 1;
  }
  else {
    if (method != RANS) {
      if (method == GZIP) {
        auVar6._8_4_ = (int)(in_size >> 0x20);
        auVar6._0_8_ = in_size;
        auVar6._12_4_ = 0x45300000;
        iVar4 = (int)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,in_size_00) - 4503599627370496.0)) * 1.05 + 100.0
                     );
        pcVar2 = (char *)malloc((long)iVar4);
        if (pcVar2 != (char *)0x0) {
          local_60 = 0;
          uStack_58 = 0;
          iVar5 = 0;
          local_50 = 0;
          local_90 = 0;
          local_78 = 0;
          local_48 = 0;
          _out_size_i = in;
          local_98 = in_size_00;
          local_88 = pcVar2;
          local_80 = iVar4;
          iVar1 = deflateInit2_(&out_size_i,level,8,0x1f,9,strat,"1.2.11",0x70);
          if (iVar1 == 0) {
            do {
              if (local_98 == 0) goto LAB_0012cb65;
              local_88 = pcVar2 + iVar5;
              local_80 = iVar4 - iVar5;
              if (local_80 == 0 || iVar4 < iVar5) {
                cram_compress_by_method_cold_3();
                return (char *)0x0;
              }
              iVar1 = deflate(&out_size_i,0);
              iVar5 = iVar4 - local_80;
            } while (iVar1 == 0);
            cram_compress_by_method_cold_2();
LAB_0012cb65:
            iVar4 = deflate(&out_size_i,4);
            if (iVar4 != 1) {
              cram_compress_by_method_cold_4();
            }
            *out_size = local_78;
            iVar4 = deflateEnd();
            if (iVar4 != 0) {
              cram_compress_by_method_cold_5();
              return pcVar2;
            }
            return pcVar2;
          }
          cram_compress_by_method_cold_1();
        }
      }
      return (char *)0x0;
    }
    iVar4 = 0;
  }
  puVar3 = rans_compress((uchar *)in,in_size_00,&out_size_i,iVar4);
  *out_size = (ulong)_out_size_i & 0xffffffff;
  return (char *)puVar3;
}

Assistant:

static char *cram_compress_by_method(char *in, size_t in_size,
				     size_t *out_size,
				     enum cram_block_method method,
				     int level, int strat) {
    switch (method) {
    case GZIP:
	return zlib_mem_deflate(in, in_size, out_size, level, strat);

    case BZIP2: {
#ifdef HAVE_LIBBZ2
	unsigned int comp_size = in_size*1.01 + 600;
	char *comp = malloc(comp_size);
	if (!comp)
	    return NULL;

	if (BZ_OK != BZ2_bzBuffToBuffCompress(comp, &comp_size,
					      in, in_size,
					      level, 0, 30)) {
	    free(comp);
	    return NULL;
	}
	*out_size = comp_size;
	return comp;
#else
	return NULL;
#endif
    }

    case LZMA:
#ifdef HAVE_LIBLZMA
	return lzma_mem_deflate(in, in_size, out_size, level);
#else
	return NULL;
#endif

    case RANS0: {
	unsigned int out_size_i;
	unsigned char *cp;
	cp = rans_compress((unsigned char *)in, in_size, &out_size_i, 0);
	*out_size = out_size_i;
	return (char *)cp;
    }

    case RANS1: {
	unsigned int out_size_i;
	unsigned char *cp;
	
	cp = rans_compress((unsigned char *)in, in_size, &out_size_i, 1);
	*out_size = out_size_i;
	return (char *)cp;
    }

    case RAW:
	break;

    default:
	return NULL;
    }

    return NULL;
}